

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_filterbank.c
# Opt level: O2

void AllPassFilter(int16_t *data_in,size_t data_length,int16_t filter_coefficient,
                  int16_t *filter_state,int16_t *data_out)

{
  ulong uVar1;
  undefined2 in_register_00000012;
  size_t sVar2;
  int iVar3;
  
  uVar1 = (ulong)(ushort)*filter_state << 0x10;
  for (sVar2 = 0; data_length != sVar2; sVar2 = sVar2 + 1) {
    iVar3 = (int)data_in[sVar2 * 2] * CONCAT22(in_register_00000012,filter_coefficient) + (int)uVar1
    ;
    data_out[sVar2] = (int16_t)((uint)iVar3 >> 0x10);
    uVar1 = (ulong)(uint)(data_in[sVar2 * 2] * 0x8000 -
                         (iVar3 >> 0x10) *
                         (CONCAT22(in_register_00000012,filter_coefficient) +
                         CONCAT22(in_register_00000012,filter_coefficient)));
  }
  *filter_state = (int16_t)(uVar1 >> 0x10);
  return;
}

Assistant:

static void AllPassFilter(const int16_t* data_in, size_t data_length,
                          int16_t filter_coefficient, int16_t* filter_state,
                          int16_t* data_out) {
  // The filter can only cause overflow (in the w16 output variable)
  // if more than 4 consecutive input numbers are of maximum value and
  // has the the same sign as the impulse responses first taps.
  // First 6 taps of the impulse response:
  // 0.6399 0.5905 -0.3779 0.2418 -0.1547 0.0990

  size_t i;
  int16_t tmp16 = 0;
  int32_t tmp32 = 0;
  int32_t state32 = ((int32_t) (*filter_state) * (1 << 16));  // Q15

  for (i = 0; i < data_length; i++) {
    tmp32 = state32 + filter_coefficient * *data_in;
    tmp16 = (int16_t) (tmp32 >> 16);  // Q(-1)
    *data_out++ = tmp16;
    state32 = (*data_in * (1 << 14)) - filter_coefficient * tmp16;  // Q14
    state32 *= 2;  // Q15.
    data_in += 2;
  }

  *filter_state = (int16_t) (state32 >> 16);  // Q(-1)
}